

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.h
# Opt level: O1

void __thiscall ThrowStatement::GenerateCode(ThrowStatement *this,ostream *out,int n)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 in_RAX;
  ostream *poVar2;
  int iVar3;
  undefined8 uStack_28;
  
  iVar3 = n;
  uStack_28 = in_RAX;
  if (0 < n) {
    do {
      std::ostream::put((char)out);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"throw ",6);
  peVar1 = (this->m_Expression).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (this->m_Expression).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
  }
  (*peVar1->_vptr_Expression[1])(peVar1,out,(ulong)(uint)n);
  uStack_28 = CONCAT17(0x3b,(undefined7)uStack_28);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(out,(char *)((long)&uStack_28 + 7),1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

virtual void GenerateCode( std::ostream& out, int n ) const
	{
		out << ::indent(n) << "throw " << expression_out(m_Expression, n) << ';' << std::endl;
	}